

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QWidget * containerWidget(QWidget *w)

{
  long lVar1;
  QAbstractScrollArea *this;
  QWidget *pQVar2;
  
  lVar1 = QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  if (lVar1 != 0) {
    lVar1 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
    if (lVar1 != 0) {
      return *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
    }
    lVar1 = QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    if (lVar1 != 0) goto LAB_00363636;
  }
  this = (QAbstractScrollArea *)QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject)
  ;
  if (this == (QAbstractScrollArea *)0x0) {
    return w;
  }
  pQVar2 = QAbstractScrollArea::viewport(this);
  if (pQVar2 != w) {
    return w;
  }
LAB_00363636:
  return *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
}

Assistant:

static QWidget *containerWidget(const QWidget *w)
{
#if QT_CONFIG(lineedit)
    if (qobject_cast<const QLineEdit *>(w)) {
        //if the QLineEdit is an embeddedWidget, we need the rule of the real widget
#if QT_CONFIG(combobox)
        if (qobject_cast<const QComboBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
#if QT_CONFIG(spinbox)
        if (qobject_cast<const QAbstractSpinBox *>(w->parentWidget()))
            return w->parentWidget();
#endif
    }
#endif // QT_CONFIG(lineedit)

#if QT_CONFIG(scrollarea)
    if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w->parentWidget())) {
        if (sa->viewport() == w)
            return w->parentWidget();
    }
#endif

    return const_cast<QWidget *>(w);
}